

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTest * __thiscall cmMakefile::GetTest(cmMakefile *this,string *testName)

{
  const_iterator cVar1;
  cmTest *pcVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
          ::find(&(this->Tests)._M_t,testName);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->Tests)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmTest *)0x0;
  }
  else {
    pcVar2 = *(cmTest **)(cVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

cmTest* cmMakefile::GetTest(const std::string& testName) const
{
  std::map<std::string, cmTest*>::const_iterator
    mi = this->Tests.find(testName);
  if(mi != this->Tests.end())
    {
    return mi->second;
    }
  return 0;
}